

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

CURLcode altsvc_load(altsvcinfo *asi,char *file)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char *local_58;
  char *lineptr;
  dynbuf buf;
  FILE *fp;
  CURLcode result;
  char *file_local;
  altsvcinfo *asi_local;
  
  (*Curl_cfree)(asi->filename);
  pcVar2 = (*Curl_cstrdup)(file);
  asi->filename = pcVar2;
  if (asi->filename == (char *)0x0) {
    asi_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    buf.toobig = (size_t)fopen64(file,"r");
    if ((FILE *)buf.toobig != (FILE *)0x0) {
      Curl_dyn_init((dynbuf *)&lineptr,0xfff);
      while (iVar1 = Curl_get_line((dynbuf *)&lineptr,(FILE *)buf.toobig), iVar1 != 0) {
        local_58 = Curl_dyn_ptr((dynbuf *)&lineptr);
        while( true ) {
          bVar3 = false;
          if ((*local_58 != '\0') && (bVar3 = true, *local_58 != ' ')) {
            bVar3 = *local_58 == '\t';
          }
          if (!bVar3) break;
          local_58 = local_58 + 1;
        }
        if (*local_58 != '#') {
          altsvc_add(asi,local_58);
        }
      }
      Curl_dyn_free((dynbuf *)&lineptr);
      fclose((FILE *)buf.toobig);
    }
    asi_local._4_4_ = CURLE_OK;
  }
  return asi_local._4_4_;
}

Assistant:

static CURLcode altsvc_load(struct altsvcinfo *asi, const char *file)
{
  CURLcode result = CURLE_OK;
  FILE *fp;

  /* we need a private copy of the filename so that the altsvc cache file
     name survives an easy handle reset */
  free(asi->filename);
  asi->filename = strdup(file);
  if(!asi->filename)
    return CURLE_OUT_OF_MEMORY;

  fp = fopen(file, FOPEN_READTEXT);
  if(fp) {
    struct dynbuf buf;
    Curl_dyn_init(&buf, MAX_ALTSVC_LINE);
    while(Curl_get_line(&buf, fp)) {
      char *lineptr = Curl_dyn_ptr(&buf);
      while(*lineptr && ISBLANK(*lineptr))
        lineptr++;
      if(*lineptr == '#')
        /* skip commented lines */
        continue;

      altsvc_add(asi, lineptr);
    }
    Curl_dyn_free(&buf); /* free the line buffer */
    fclose(fp);
  }
  return result;
}